

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O0

void __thiscall
tchecker::details::expression_typechecker_t::normalize_clock_comparison
          (expression_typechecker_t *this,binary_operator_t *op,
          shared_ptr<tchecker::typed_expression_t> *left,
          shared_ptr<tchecker::typed_expression_t> *right,binary_expression_t *expr)

{
  bool bVar1;
  expression_type_t eVar2;
  binary_operator_t bVar3;
  expression_type_t right_00;
  element_type *peVar4;
  expression_t *peVar5;
  string local_178;
  string local_158;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined4 local_68;
  int local_64;
  shared_ptr<tchecker::typed_int_expression_t> local_60;
  undefined1 local_4c [24];
  binary_operator_t local_34;
  binary_expression_t *pbStack_30;
  expression_type_t new_left_type;
  binary_expression_t *expr_local;
  shared_ptr<tchecker::typed_expression_t> *right_local;
  shared_ptr<tchecker::typed_expression_t> *left_local;
  binary_operator_t *op_local;
  expression_typechecker_t *this_local;
  
  pbStack_30 = expr;
  expr_local = (binary_expression_t *)right;
  right_local = left;
  left_local = (shared_ptr<tchecker::typed_expression_t> *)op;
  op_local = (binary_operator_t *)this;
  bVar1 = predicate(*op);
  if (bVar1) {
    peVar4 = std::
             __shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)expr_local);
    eVar2 = typed_expression_t::type(peVar4);
    bVar1 = clock_involved(eVar2);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)right_local);
      eVar2 = typed_expression_t::type(peVar4);
      bVar1 = clock_involved(eVar2);
      if (bVar1) {
        peVar4 = std::
                 __shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)right_local);
        eVar2 = typed_expression_t::type(peVar4);
        peVar4 = std::
                 __shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)expr_local);
        right_00 = typed_expression_t::type(peVar4);
        local_34 = type_binary(EXPR_OP_MINUS,eVar2,right_00);
        local_4c._0_4_ = 7;
        std::
        make_shared<tchecker::typed_binary_expression_t,tchecker::expression_type_t&,tchecker::binary_operator_t,std::shared_ptr<tchecker::typed_expression_t>&,std::shared_ptr<tchecker::typed_expression_t>&>
                  ((expression_type_t *)(local_4c + 4),&local_34,
                   (shared_ptr<tchecker::typed_expression_t> *)local_4c,right_local);
        std::shared_ptr<tchecker::typed_expression_t>::operator=
                  (right_local,(shared_ptr<tchecker::typed_binary_expression_t> *)(local_4c + 4));
        std::shared_ptr<tchecker::typed_binary_expression_t>::~shared_ptr
                  ((shared_ptr<tchecker::typed_binary_expression_t> *)(local_4c + 4));
        local_64 = 1;
        local_68 = 0;
        std::make_shared<tchecker::typed_int_expression_t,tchecker::expression_type_t,int>
                  ((expression_type_t *)&local_60,&local_64);
        std::shared_ptr<tchecker::typed_expression_t>::operator=
                  ((shared_ptr<tchecker::typed_expression_t> *)expr_local,&local_60);
        std::shared_ptr<tchecker::typed_int_expression_t>::~shared_ptr(&local_60);
        peVar4 = std::
                 __shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)right_local);
        eVar2 = typed_expression_t::type(peVar4);
        if (eVar2 == EXPR_TYPE_BAD) {
          expression_t::to_string_abi_cxx11_
                    (&local_128,
                     (expression_t *)
                     ((long)&pbStack_30->field_0x0 + *(long *)(*(long *)pbStack_30 + -0x38)));
          std::operator+(&local_108,"in expression ",&local_128);
          std::operator+(&local_e8,&local_108,", invalid comparison of clock expressions ");
          peVar5 = binary_expression_t::left_operand(pbStack_30);
          expression_t::to_string_abi_cxx11_(&local_158,peVar5);
          std::operator+(&local_c8,&local_e8,&local_158);
          std::operator+(&local_a8,&local_c8," and ");
          peVar5 = binary_expression_t::right_operand(pbStack_30);
          expression_t::to_string_abi_cxx11_(&local_178,peVar5);
          std::operator+(&local_88,&local_a8,&local_178);
          std::
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator()(&this->_error,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_128);
        }
      }
      else {
        std::swap<tchecker::typed_expression_t>
                  (right_local,(shared_ptr<tchecker::typed_expression_t> *)expr_local);
        bVar3 = reverse_cmp(*(binary_operator_t *)
                             &(left_local->
                              super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr);
        *(binary_operator_t *)
         &(left_local->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>)
          ._M_ptr = bVar3;
      }
    }
  }
  return;
}

Assistant:

void normalize_clock_comparison(enum tchecker::binary_operator_t & op, std::shared_ptr<tchecker::typed_expression_t> & left,
                                  std::shared_ptr<tchecker::typed_expression_t> & right,
                                  tchecker::binary_expression_t const & expr)
  {
    // do not do anything if `op` is not a comparator or if not clock is involved on the right-hand side
    if (!tchecker::predicate(op) || !tchecker::clock_involved(right->type()))
      return;

    // `op` is a comparator and clocks appear on `right` but not on `left`: swap left/right and reverse op
    if (!tchecker::clock_involved(left->type())) {
      std::swap(left, right);
      op = tchecker::reverse_cmp(op);
    }
    // `op` is a comparator and clocks appear both on `left` and `right`: rewrite as left-right op 0
    else {
      enum tchecker::expression_type_t new_left_type = type_binary(tchecker::EXPR_OP_MINUS, left->type(), right->type());
      left = std::make_shared<tchecker::typed_binary_expression_t>(new_left_type, tchecker::EXPR_OP_MINUS, left, right);
      right = std::make_shared<tchecker::typed_int_expression_t>(tchecker::EXPR_TYPE_INTTERM, 0);
      if (left->type() == tchecker::EXPR_TYPE_BAD)
        _error("in expression " + expr.to_string() + ", invalid comparison of clock expressions " +
               expr.left_operand().to_string() + " and " + expr.right_operand().to_string());
    }
  }